

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINSetDampingFn(void *kinmem,KINDampingFn damping_fn)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,0xfc,"KINSetDampingFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
  }
  else {
    *(KINDampingFn *)((long)kinmem + 0x1d0) = damping_fn;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINSetDampingFn(void* kinmem, KINDampingFn damping_fn)
{
  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return KIN_MEM_NULL;
  }
  KINMem kin_mem = (KINMem)kinmem;

  kin_mem->kin_damping_fn = damping_fn;

  return KIN_SUCCESS;
}